

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

optional<tinyusdz::value::AssetPath> * __thiscall
tinyusdz::primvar::PrimVar::get_value<tinyusdz::value::AssetPath>
          (optional<tinyusdz::value::AssetPath> *__return_storage_ptr__,PrimVar *this)

{
  undefined8 *puVar1;
  vtable_type *pvVar2;
  uint32_t uVar3;
  bool bVar4;
  undefined1 local_60 [8];
  storage_t<tinyusdz::value::AssetPath> local_58;
  
  pvVar2 = (this->_value).v_.vtable;
  if (pvVar2 == (vtable_type *)0x0) {
    bVar4 = false;
  }
  else {
    uVar3 = (*pvVar2->type_id)();
    bVar4 = uVar3 == 4;
  }
  if ((bVar4) || ((this->_blocked & 1U) != 0)) {
LAB_0028a61c:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = 0;
  }
  else {
    pvVar2 = (this->_value).v_.vtable;
    if (pvVar2 != (vtable_type *)0x0) {
      uVar3 = (*pvVar2->type_id)();
      if (uVar3 == 0) goto LAB_0028a61c;
      pvVar2 = (this->_value).v_.vtable;
      if (pvVar2 != (vtable_type *)0x0) {
        uVar3 = (*pvVar2->type_id)();
        if (uVar3 == 1) goto LAB_0028a61c;
      }
    }
    tinyusdz::value::Value::get_value<tinyusdz::value::AssetPath>
              ((optional<tinyusdz::value::AssetPath> *)local_60,&this->_value,false);
    __return_storage_ptr__->has_value_ = local_60[0];
    if (local_60[0] == true) {
      puVar1 = (undefined8 *)((long)&__return_storage_ptr__->contained + 0x10);
      *(undefined8 **)&__return_storage_ptr__->contained = puVar1;
      if (local_58.data.__align == (anon_struct_8_0_00000001_for___align)((long)local_60 + 0x18)) {
        *puVar1 = CONCAT71(local_58._17_7_,local_58._16_1_);
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = local_58._24_8_;
      }
      else {
        *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
             local_58.data.__align;
        *(ulong *)((long)&__return_storage_ptr__->contained + 0x10) =
             CONCAT71(local_58._17_7_,local_58._16_1_);
      }
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_58._8_8_;
      local_58._8_8_ = 0;
      local_58._16_1_ = 0;
      puVar1 = (undefined8 *)((long)&__return_storage_ptr__->contained + 0x30);
      *(undefined8 **)((long)&__return_storage_ptr__->contained + 0x20) = puVar1;
      if ((undefined1 *)local_58._32_8_ == local_60 + 0x38) {
        *puVar1 = CONCAT71(local_58._49_7_,local_58._48_1_);
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x38) = local_58._56_8_;
      }
      else {
        *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = local_58._32_8_;
        *(ulong *)((long)&__return_storage_ptr__->contained + 0x30) =
             CONCAT71(local_58._49_7_,local_58._48_1_);
      }
      *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x28) = local_58._40_8_;
      local_58._40_8_ = 0;
      local_58._48_1_ = 0;
      local_58.data._0_8_ = (undefined8)((long)local_60 + 0x18);
      local_58._32_8_ = local_60 + 0x38;
      nonstd::optional_lite::detail::storage_t<tinyusdz::value::AssetPath>::destruct_value
                ((storage_t<tinyusdz::value::AssetPath> *)(local_60 + 8));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {

    if (is_blocked()) {
      return nonstd::nullopt;
    }

    if (!has_default()) {
      return nonstd::nullopt;
    }

    return _value.get_value<T>();
  }